

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

format_decimal_result<char_*> __thiscall
fmt::v10::detail::format_decimal<char,unsigned__int128>
          (detail *this,char *out,unsigned___int128 value,int size)

{
  format_decimal_result<char_*> fVar1;
  int iVar2;
  size_t value_00;
  char *pcVar3;
  int in_ECX;
  undefined4 in_register_00000014;
  undefined1 auVar4 [16];
  undefined8 in_stack_ffffffffffffff48;
  detail *pdVar5;
  undefined8 in_stack_ffffffffffffff50;
  char *end;
  char cStack_68;
  int size_local;
  unsigned___int128 value_local;
  detail *local_50;
  char *out_local;
  detail *local_38;
  
  value_local._0_8_ = CONCAT44(in_register_00000014,size);
  auVar4._8_8_ = in_stack_ffffffffffffff50;
  auVar4._0_8_ = in_stack_ffffffffffffff48;
  iVar2 = count_digits((detail *)out,(uint128_opt)auVar4);
  if (iVar2 <= in_ECX) {
    _cStack_68 = out;
    local_50 = this + in_ECX;
    while ((_cStack_68 < (char *)0x64) <= (ulong)value_local) {
      local_50 = local_50 + -2;
      pdVar5 = local_50;
      value_00 = __umodti3(_cStack_68,(ulong)value_local);
      pcVar3 = digits2(value_00);
      *(undefined2 *)pdVar5 = *(undefined2 *)pcVar3;
      auVar4 = __udivti3(_cStack_68,(ulong)value_local,100,0);
      value_local._0_8_ = auVar4._8_8_;
      _cStack_68 = auVar4._0_8_;
    }
    if ((ulong)value_local == 0 && (ulong)((char *)0x9 < _cStack_68) <= -(ulong)value_local) {
      local_38 = local_50 + -1;
      local_50[-1] = (detail)(cStack_68 + '0');
    }
    else {
      local_38 = local_50 + -2;
      pdVar5 = local_38;
      pcVar3 = digits2((size_t)_cStack_68);
      *(undefined2 *)pdVar5 = *(undefined2 *)pcVar3;
    }
    fVar1.end = (char *)(this + in_ECX);
    fVar1.begin = (char *)local_38;
    return fVar1;
  }
  assert_fail("/workspace/llm4binary/github/license_c_cmakelists/oneapi-src[P]level-zero/third_party/spdlog_headers/spdlog/fmt/bundled/format.h"
              ,0x51e,"invalid digit count");
}

Assistant:

FMT_CONSTEXPR20 auto format_decimal(Char* out, UInt value, int size)
    -> format_decimal_result<Char*> {
  FMT_ASSERT(size >= count_digits(value), "invalid digit count");
  out += size;
  Char* end = out;
  while (value >= 100) {
    // Integer division is slow so do it for a group of two digits instead
    // of for every digit. The idea comes from the talk by Alexandrescu
    // "Three Optimization Tips for C++". See speed-test for a comparison.
    out -= 2;
    copy2(out, digits2(static_cast<size_t>(value % 100)));
    value /= 100;
  }
  if (value < 10) {
    *--out = static_cast<Char>('0' + value);
    return {out, end};
  }
  out -= 2;
  copy2(out, digits2(static_cast<size_t>(value)));
  return {out, end};
}